

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTypeID cp_decl_struct(CPState *cp,CPDecl *sdecl,CTInfo sinfo)

{
  CTypeID sid_00;
  int iVar1;
  CTypeID CVar2;
  uint local_aec;
  uint local_ae4;
  CType *tct;
  CType *pCStack_ad0;
  CTypeID fieldid_1;
  CType *ct_1;
  CTSize bsz;
  CTypeID fieldid;
  CType *ct;
  CTypeID ctypeid;
  CPscl scl;
  CPDecl decl;
  int lastdecl;
  CTypeID lastid;
  CTypeID sid;
  CTInfo sinfo_local;
  CPDecl *sdecl_local;
  CPState *cp_local;
  CType *local_a0;
  CType *ct_2;
  
  sid_00 = cp_struct_name(cp,sdecl,sinfo);
  iVar1 = cp_opt(cp,0x7b);
  if (iVar1 == 0) {
    return sid_00;
  }
  decl.stack[99].name.gcptr64._0_4_ = 0;
  decl.stack[99].name.gcptr64._4_4_ = sid_00;
LAB_0018549e:
  if (cp->tok == 0x7d) {
    cp_check(cp,0x7d);
    cp->cts->tab[decl.stack[99].name.gcptr64._4_4_].sib = 0;
    cp_decl_attributes(cp,sdecl);
    cp_struct_layout(cp,sid_00,sdecl->attr);
    return sid_00;
  }
  ct._4_4_ = cp_decl_spec(cp,(CPDecl *)&ctypeid,0x20000);
  decl.pos = 0xe;
  if (ct._4_4_ != 0) {
    decl.pos = 4;
  }
  do {
    if ((int)decl.stack[99].name.gcptr64 != 0) {
      cp_err_token(cp,0x7d);
    }
    decl.specattr = 0xffffffff;
    cp_declarator(cp,(CPDecl *)&ctypeid);
    ct._0_4_ = cp_decl_intern(cp,(CPDecl *)&ctypeid);
    if ((ct._4_4_ & 0x20000) == 0) {
      ct_1._0_4_ = 0x7f;
      CVar2 = lj_ctype_new(cp->cts,&stack0xfffffffffffff530);
      for (local_a0 = cp->cts->tab + (CTypeID)ct; local_a0->info >> 0x1c == 8;
          local_a0 = cp->cts->tab + (local_a0->info & 0xffff)) {
      }
      if (decl.specattr == 0xffffffff) {
        if ((local_a0->info >> 0x1c == 3) && (local_a0->size == 0xffffffff)) {
          decl.stack[99].name.gcptr64._0_4_ = 1;
        }
        if (decl.cp != (CPState *)0x0) goto LAB_0018589a;
        if (((local_a0->info >> 0x1c != 1) || ((local_a0->info & 0x100000) != 0)) &&
           (local_a0->info >> 0x1c != 5)) {
          cp_err_token(cp,0x100);
        }
        pCStack_ad0->info = (CTypeID)ct + 0x80030000;
        if (local_a0->info >> 0x1c == 1) {
          local_ae4 = decl.redir._4_4_ | 0x80000000;
        }
        else {
          local_ae4 = 0;
        }
        pCStack_ad0->size = local_ae4;
      }
      else {
        ct_1._0_4_ = decl.specattr;
        if (((local_a0->info & 0xf4000000) != 0) ||
           (((decl.specattr == 0 && (decl.cp != (CPState *)0x0)) || (0x20 < local_a0->size << 3))))
        {
LAB_00185880:
          cp_errmsg(cp,0x3a,LJ_ERR_BADVAL);
        }
        if ((local_a0->info & 0x8000000) == 0) {
          local_aec = local_a0->size << 3;
        }
        else {
          local_aec = 1;
        }
        if (local_aec < decl.specattr) goto LAB_00185880;
LAB_0018589a:
        pCStack_ad0->info = (CTypeID)ct + (CTInfo)ct_1 * 0x10000 + 0x90000000;
        pCStack_ad0->size = decl.redir._4_4_;
        if (decl.cp != (CPState *)0x0) {
          *(byte *)&((decl.cp)->val).field_0 = *(byte *)&((decl.cp)->val).field_0 | 0x20;
          (pCStack_ad0->name).gcptr64 = (uint64_t)decl.cp;
        }
      }
      cp->cts->tab[decl.stack[99].name.gcptr64._4_4_].sib = (CTypeID1)CVar2;
      decl.stack[99].name.gcptr64._4_4_ = CVar2;
    }
    else {
      ct_1._4_4_ = cp_decl_constinit(cp,(CType **)&bsz,(CTypeID)ct);
      cp->cts->tab[decl.stack[99].name.gcptr64._4_4_].sib = (CTypeID1)ct_1._4_4_;
      *(byte *)&((decl.cp)->val).field_0 = *(byte *)&((decl.cp)->val).field_0 | 0x20;
      (_bsz->name).gcptr64 = (uint64_t)decl.cp;
      decl.stack[99].name.gcptr64._4_4_ = ct_1._4_4_;
    }
    iVar1 = cp_opt(cp,0x2c);
    if (iVar1 == 0) break;
    cp_decl_reset((CPDecl *)&ctypeid);
  } while( true );
  cp_check(cp,0x3b);
  goto LAB_0018549e;
}

Assistant:

static CTypeID cp_decl_struct(CPState *cp, CPDecl *sdecl, CTInfo sinfo)
{
  CTypeID sid = cp_struct_name(cp, sdecl, sinfo);
  if (cp_opt(cp, '{')) {  /* Struct/union definition. */
    CTypeID lastid = sid;
    int lastdecl = 0;
    while (cp->tok != '}') {
      CPDecl decl;
      CPscl scl = cp_decl_spec(cp, &decl, CDF_STATIC);
      decl.mode = scl ? CPARSE_MODE_DIRECT :
	CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT|CPARSE_MODE_FIELD;

      for (;;) {
	CTypeID ctypeid;

	if (lastdecl) cp_err_token(cp, '}');

	/* Parse field declarator. */
	decl.bits = CTSIZE_INVALID;
	cp_declarator(cp, &decl);
	ctypeid = cp_decl_intern(cp, &decl);

	if ((scl & CDF_STATIC)) {  /* Static constant in struct namespace. */
	  CType *ct;
	  CTypeID fieldid = cp_decl_constinit(cp, &ct, ctypeid);
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	  ctype_setname(ct, decl.name);
	} else {
	  CTSize bsz = CTBSZ_FIELD;  /* Temp. for layout phase. */
	  CType *ct;
	  CTypeID fieldid = lj_ctype_new(cp->cts, &ct);  /* Do this first. */
	  CType *tct = ctype_raw(cp->cts, ctypeid);

	  if (decl.bits == CTSIZE_INVALID) {  /* Regular field. */
	    if (ctype_isarray(tct->info) && tct->size == CTSIZE_INVALID)
	      lastdecl = 1;  /* a[] or a[?] must be the last declared field. */

	    /* Accept transparent struct/union/enum. */
	    if (!decl.name) {
	      if (!((ctype_isstruct(tct->info) && !(tct->info & CTF_VLA)) ||
		    ctype_isenum(tct->info)))
		cp_err_token(cp, CTOK_IDENT);
	      ct->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_SUBTYPE) + ctypeid);
	      ct->size = ctype_isstruct(tct->info) ?
			 (decl.attr|0x80000000u) : 0;  /* For layout phase. */
	      goto add_field;
	    }
	  } else {  /* Bitfield. */
	    bsz = decl.bits;
	    if (!ctype_isinteger_or_bool(tct->info) ||
		(bsz == 0 && decl.name) || 8*tct->size > CTBSZ_MAX ||
		bsz > ((tct->info & CTF_BOOL) ? 1 : 8*tct->size))
	      cp_errmsg(cp, ':', LJ_ERR_BADVAL);
	  }

	  /* Create temporary field for layout phase. */
	  ct->info = CTINFO(CT_FIELD, ctypeid + (bsz << CTSHIFT_BITCSZ));
	  ct->size = decl.attr;
	  if (decl.name) ctype_setname(ct, decl.name);

	add_field:
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	}
	if (!cp_opt(cp, ',')) break;
	cp_decl_reset(&decl);
      }
      cp_check(cp, ';');
    }
    cp_check(cp, '}');
    ctype_get(cp->cts, lastid)->sib = 0;  /* Drop sib = 1 for empty structs. */
    cp_decl_attributes(cp, sdecl);  /* Layout phase needs postfix attributes. */
    cp_struct_layout(cp, sid, sdecl->attr);
  }
  return sid;
}